

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

string * __thiscall
flatbuffers::PosixPath_abi_cxx11_(string *__return_storage_ptr__,flatbuffers *this,char *path)

{
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  char local_b [2];
  allocator<char> local_9;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,(char *)this,&local_9);
  __first._M_current = (__return_storage_ptr__->_M_dataplus)._M_p;
  local_b[1] = 0x5c;
  local_b[0] = '/';
  std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
            (__first,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )(__first._M_current + __return_storage_ptr__->_M_string_length),local_b + 1,
             local_b);
  return __return_storage_ptr__;
}

Assistant:

std::string PosixPath(const char *path) {
  std::string p = path;
  std::replace(p.begin(), p.end(), '\\', '/');
  return p;
}